

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O3

int __thiscall crnlib::dynamic_stream::close(dynamic_stream *this,int __fd)

{
  byte bVar1;
  uchar *p;
  undefined8 unaff_RBX;
  
  bVar1 = (this->super_data_stream).field_0x1a;
  if ((bVar1 & 1) != 0) {
    (this->super_data_stream).field_0x1a = bVar1 & 0xfe;
    p = (this->m_buf).m_p;
    if (p != (uchar *)0x0) {
      crnlib_free(p);
      (this->m_buf).m_p = (uchar *)0x0;
      (this->m_buf).m_size = 0;
      (this->m_buf).m_capacity = 0;
    }
    this->m_ofs = 0;
  }
  return (uint)CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar1) & 0xffffff01;
}

Assistant:

virtual bool close() {
    if (m_opened) {
      m_opened = false;
      m_buf.clear();
      m_ofs = 0;
      return true;
    }

    return false;
  }